

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O0

RC __thiscall QL_NodeSel::PrintNode(QL_NodeSel *this,int numTabs)

{
  Condition condition;
  ostream *this_00;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  void *local_28;
  int local_20;
  int local_1c;
  int j;
  int i_1;
  int i;
  int numTabs_local;
  QL_NodeSel *this_local;
  
  i_1 = numTabs;
  _i = this;
  for (j = 0; j < i_1; j = j + 1) {
    std::operator<<((ostream *)&std::cout,"\t");
  }
  this_00 = std::operator<<((ostream *)&std::cout,"--SEL: ");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  for (local_1c = 0; local_1c < (this->super_QL_Node).condIndex; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < i_1; local_20 = local_20 + 1) {
      std::operator<<((ostream *)&std::cout,"\t");
    }
    memcpy(&local_58,
           ((this->super_QL_Node).qlm)->condptr + (this->super_QL_Node).condsInNode[local_1c],0x38);
    condition.lhsAttr.attrName = (char *)uStack_50;
    condition.lhsAttr.relName = (char *)local_58;
    condition.op = (undefined4)local_48;
    condition.bRhsIsAttr = local_48._4_4_;
    condition.rhsAttr.relName = (char *)uStack_40;
    condition.rhsAttr.attrName = (char *)local_38;
    condition.rhsValue._0_8_ = uStack_30;
    condition.rhsValue.data = local_28;
    QL_Node::PrintCondition(&this->super_QL_Node,condition);
    std::operator<<((ostream *)&std::cout,"\n");
  }
  (*this->prevNode->_vptr_QL_Node[5])(this->prevNode,(ulong)(i_1 + 1));
  return 0;
}

Assistant:

RC QL_NodeSel::PrintNode(int numTabs){
  for(int i=0; i < numTabs; i++){
    cout << "\t";
  }
  cout << "--SEL: " << endl;
  for(int i = 0; i < condIndex; i++){
    for(int j=0; j <numTabs; j++){
      cout << "\t";
    }
    PrintCondition(qlm.condptr[condsInNode[i]]);
    cout << "\n";
  }
  prevNode.PrintNode(numTabs + 1);

  return (0);
}